

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# askf_tx3.cpp
# Opt level: O0

int __thiscall
CVmConsole::askfile(CVmConsole *this,char *prompt,size_t prompt_len,char *reply,size_t replen,
                   int param_6,os_filetype_t param_7,int bypass_script)

{
  int iVar1;
  CVmConsole *in_RCX;
  undefined8 in_RDX;
  undefined8 in_RSI;
  long *in_RDI;
  CVmConsole *in_R8;
  undefined4 in_R9D;
  undefined4 in_stack_ffffffffffffffc8;
  int local_4;
  
  (**(code **)(*in_RDI + 8))(in_RDI,in_RSI,in_RDX);
  format_text(in_R8,(char *)CONCAT44(in_R9D,in_stack_ffffffffffffffc8));
  iVar1 = read_line(in_RCX,(char *)in_R8,CONCAT44(in_R9D,in_stack_ffffffffffffffc8),
                    (int)((ulong)in_RDI >> 0x20));
  if (iVar1 == 0) {
    local_4 = 0;
    if (*(char *)&in_RCX->_vptr_CVmConsole == '\0') {
      local_4 = 2;
    }
  }
  else {
    local_4 = 1;
  }
  return local_4;
}

Assistant:

int CVmConsole::askfile(VMG_ const char *prompt, size_t prompt_len,
                        char *reply, size_t replen,
                        int /*dialog_type*/, os_filetype_t /*file_type*/,
                        int bypass_script)
{
    /* show the prompt */
    format_text(vmg_ prompt, prompt_len);
    format_text(vmg_ " >");

    /* ask for the filename */
    if (read_line(vmg_ reply, replen, bypass_script))
        return OS_AFE_FAILURE;

    /* 
     *   if they entered an empty line, return "cancel"; otherwise, return
     *   success 
     */
    return (reply[0] == '\0' ? OS_AFE_CANCEL : OS_AFE_SUCCESS);
}